

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triplets.h
# Opt level: O1

void __thiscall
iDynTree::Triplets::addSubMatrix<(iDynTree::MatrixStorageOrdering)0>
          (Triplets *this,size_t startingRow,size_t startingColumn,
          SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *matrix)

{
  pointer *ppTVar1;
  pointer pTVar2;
  pointer pTVar3;
  iterator __position;
  size_t sVar4;
  const_iterator it;
  const_iterator it_1;
  ConstIterator local_90;
  ConstIterator local_60;
  
  pTVar2 = (this->m_triplets).
           super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar3 = (this->m_triplets).
           super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = VectorDynSize::size(&matrix->m_values);
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve
            (&this->m_triplets,((long)pTVar2 - (long)pTVar3 >> 3) * -0x5555555555555555 + sVar4);
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::ConstIterator
            (&local_90,matrix,true);
  while( true ) {
    SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::ConstIterator
              (&local_60,matrix,false);
    if ((local_90.m_matrix == local_60.m_matrix) && (local_90.m_index == -1)) break;
    Triplet::Triplet((Triplet *)&local_60,local_90.m_currentTriplet.row + startingRow,
                     local_90.m_currentTriplet.column + startingColumn,
                     local_90.m_currentTriplet.value);
    __position._M_current =
         (this->m_triplets).
         super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_triplets).super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::
      _M_realloc_insert<iDynTree::Triplet>(&this->m_triplets,__position,(Triplet *)&local_60);
    }
    else {
      (__position._M_current)->value = (double)local_60.m_currentTriplet.row;
      (__position._M_current)->row = (size_t)local_60.m_matrix;
      (__position._M_current)->column = local_60._8_8_;
      ppTVar1 = &(this->m_triplets).
                 super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
    SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::operator++(&local_90);
  }
  return;
}

Assistant:

void addSubMatrix(std::size_t startingRow,
                      std::size_t startingColumn,
                      const SparseMatrix<ordering>& matrix)
    {
        //if enough memory has been reserved this should be a noop
        m_triplets.reserve(m_triplets.size() + matrix.numberOfNonZeros());

        for (typename SparseMatrix<ordering>::const_iterator it(matrix.begin());
             it != matrix.end(); ++it) {
            m_triplets.push_back(Triplet(startingRow + it->row,
                                         startingColumn + it->column,
                                         it->value));
        }
    }